

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O0

void re2::RE2NeverNewline(void)

{
  bool bVar1;
  ostream *poVar2;
  LogMessage local_5f8;
  StringPiece local_478;
  LogMessage local_468;
  StringPiece *local_2e8;
  StringPiece local_2e0;
  undefined1 local_2d0 [8];
  StringPiece m;
  StringPiece local_130;
  StringPiece local_120;
  undefined1 local_110 [8];
  RE2 re;
  NeverTest *t;
  undefined1 local_20 [4];
  int i;
  Options opt;
  
  RE2::Options::Options((Options *)local_20);
  RE2::Options::set_never_nl((Options *)local_20,true);
  for (t._4_4_ = 0; t._4_4_ < 5; t._4_4_ = t._4_4_ + 1) {
    re._216_8_ = never_tests + (long)t._4_4_ * 0x18;
    StringPiece::StringPiece(&local_120,*(char **)re._216_8_);
    RE2::RE2((RE2 *)local_110,&local_120,(Options *)local_20);
    if (*(long *)(re._216_8_ + 0x10) == 0) {
      StringPiece::StringPiece(&local_130,*(char **)(re._216_8_ + 8));
      bVar1 = RE2::PartialMatch<>(&local_130,(RE2 *)local_110);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&m.length_,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
                   ,0x525);
        poVar2 = LogMessage::stream((LogMessage *)&m.length_);
        std::operator<<(poVar2,"Check failed: !(re.PartialMatch(t.text, re))");
        LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&m.length_);
      }
    }
    else {
      StringPiece::StringPiece((StringPiece *)local_2d0);
      StringPiece::StringPiece(&local_2e0,*(char **)(re._216_8_ + 8));
      local_2e8 = (StringPiece *)local_2d0;
      bVar1 = RE2::PartialMatch<re2::StringPiece*>(&local_2e0,(RE2 *)local_110,&local_2e8);
      if (!bVar1) {
        LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_468,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
                   ,0x528);
        poVar2 = LogMessage::stream(&local_468);
        std::operator<<(poVar2,"Check failed: re.PartialMatch(t.text, re, &m)");
        LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_468);
      }
      StringPiece::StringPiece(&local_478,*(char **)(re._216_8_ + 0x10));
      bVar1 = operator==((StringPiece *)local_2d0,&local_478);
      if (!bVar1) {
        LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_5f8,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
                   ,0x529);
        poVar2 = LogMessage::stream(&local_5f8);
        std::operator<<(poVar2,"Check failed: (m) == (t.match)");
        LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_5f8);
      }
    }
    RE2::~RE2((RE2 *)local_110);
  }
  return;
}

Assistant:

TEST(RE2, NeverNewline) {
  RE2::Options opt;
  opt.set_never_nl(true);
  for (int i = 0; i < arraysize(never_tests); i++) {
    const NeverTest& t = never_tests[i];
    RE2 re(t.regexp, opt);
    if (t.match == NULL) {
      EXPECT_FALSE(re.PartialMatch(t.text, re));
    } else {
      StringPiece m;
      EXPECT_TRUE(re.PartialMatch(t.text, re, &m));
      EXPECT_EQ(m, t.match);
    }
  }
}